

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O1

int Curl_pgrsUpdate(connectdata *conn)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  SessionHandle *data;
  curl_xferinfo_callback p_Var4;
  curl_progress_callback p_Var5;
  FILE *whereto;
  double dVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  curl_off_t cVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  double dVar17;
  timeval newer;
  timeval older;
  long local_b0;
  long local_a8;
  char time_spent [10];
  char time_total [10];
  char time_left [10];
  char max5 [6] [10];
  
  data = conn->data;
  iVar16 = (data->progress).speeder_c;
  newer = curlx_tvnow();
  lVar7 = newer.tv_sec;
  dVar17 = (double)(newer.tv_usec - (data->progress).start.tv_usec) / 1000000.0 +
           (double)(lVar7 - (data->progress).start.tv_sec);
  (data->progress).timespent = dVar17;
  lVar9 = (data->progress).downloaded;
  lVar10 = (data->progress).lastshow;
  dVar6 = (double)(~-(ulong)(0.0 < dVar17) & 0x3ff0000000000000 |
                  -(ulong)(0.0 < dVar17) & (ulong)dVar17);
  lVar8 = (long)((double)lVar9 / dVar6);
  (data->progress).dlspeed = lVar8;
  lVar15 = (data->progress).uploaded;
  lVar13 = (long)((double)lVar15 / dVar6);
  (data->progress).ulspeed = lVar13;
  if (lVar10 != lVar7) {
    iVar16 = iVar16 % 6;
    (data->progress).lastshow = lVar7;
    if (lVar15 < lVar9) {
      lVar15 = lVar9;
    }
    (data->progress).speeder[iVar16] = lVar15;
    (data->progress).speeder_time[iVar16].tv_sec = lVar7;
    (data->progress).speeder_time[iVar16].tv_usec = newer.tv_usec;
    iVar2 = (data->progress).speeder_c;
    (data->progress).speeder_c = iVar2 + 1U;
    if (iVar2 == 0) {
      if (lVar8 < lVar13) {
        lVar8 = lVar13;
      }
    }
    else {
      uVar14 = 0;
      if (4 < iVar2) {
        uVar14 = (ulong)((iVar2 + 1U) % 6);
      }
      uVar12 = (ulong)(uint)((int)uVar14 << 4);
      older.tv_usec = *(__suseconds_t *)((long)&(data->progress).speeder_time[0].tv_usec + uVar12);
      older.tv_sec = *(__time_t *)((long)&(data->progress).speeder_time[0].tv_sec + uVar12);
      lVar8 = curlx_tvdiff(newer,older);
      lVar8 = lVar8 + (ulong)(lVar8 == 0);
      lVar9 = (data->progress).speeder[iVar16] - (data->progress).speeder[uVar14];
      if (lVar9 < 0x418938) {
        lVar8 = (lVar9 * 1000) / lVar8;
      }
      else {
        lVar8 = (long)((double)lVar9 / ((double)lVar8 / 1000.0));
      }
    }
    (data->progress).current_speed = lVar8;
  }
  uVar3 = (data->progress).flags;
  if ((uVar3 & 0x10) != 0) {
    return 0;
  }
  p_Var4 = (data->set).fxferinfo;
  if (p_Var4 != (curl_xferinfo_callback)0x0) {
    iVar16 = (*p_Var4)((data->set).progress_client,(data->progress).size_dl,
                       (data->progress).downloaded,(data->progress).size_ul,
                       (data->progress).uploaded);
LAB_00486851:
    if (iVar16 != 0) {
      Curl_failf(data,"Callback aborted");
    }
    return iVar16;
  }
  p_Var5 = (data->set).fprogress;
  if (p_Var5 != (curl_progress_callback)0x0) {
    iVar16 = (*p_Var5)((data->set).progress_client,(double)(data->progress).size_dl,
                       (double)(data->progress).downloaded,(double)(data->progress).size_ul,
                       (double)(data->progress).uploaded);
    goto LAB_00486851;
  }
  if (lVar10 == lVar7) {
    return 0;
  }
  if (-1 < (char)uVar3) {
    if ((data->state).resume_from != 0) {
      curl_mfprintf((data->set).err,"** Resuming transfer from byte position %ld\n");
    }
    curl_mfprintf((data->set).err,
                  "  %% Total    %% Received %% Xferd  Average Speed   Time    Time     Time  Current\n                                 Dload  Upload   Total   Spent    Left  Speed\n"
                 );
    piVar1 = &(data->progress).flags;
    *(byte *)piVar1 = (byte)*piVar1 | 0x80;
  }
  uVar3 = (data->progress).flags;
  if (((uVar3 & 0x20) == 0) || (lVar9 = (data->progress).ulspeed, lVar9 < 1)) {
    lVar9 = 0;
LAB_0048692d:
    local_a8 = 0;
  }
  else {
    uVar14 = (data->progress).size_ul;
    lVar9 = (long)uVar14 / lVar9;
    if ((long)uVar14 < 0x2711) {
      if ((long)uVar14 < 1) goto LAB_0048692d;
      cVar11 = (data->progress).uploaded * 100;
    }
    else {
      cVar11 = (data->progress).uploaded;
      uVar14 = uVar14 / 100;
    }
    local_a8 = cVar11 / (long)uVar14;
  }
  if (((uVar3 & 0x40) == 0) || (lVar10 = (data->progress).dlspeed, lVar10 < 1)) {
    lVar10 = 0;
LAB_004869ab:
    local_b0 = 0;
  }
  else {
    uVar14 = (data->progress).size_dl;
    lVar10 = (long)uVar14 / lVar10;
    if ((long)uVar14 < 0x2711) {
      if ((long)uVar14 < 1) goto LAB_004869ab;
      cVar11 = (data->progress).downloaded * 100;
    }
    else {
      cVar11 = (data->progress).downloaded;
      uVar14 = uVar14 / 100;
    }
    local_b0 = cVar11 / (long)uVar14;
  }
  if (lVar10 < lVar9) {
    lVar10 = lVar9;
  }
  cVar11 = 0;
  if (0 < lVar10) {
    cVar11 = lVar10 - (long)dVar17;
  }
  time2str(time_left,cVar11);
  time2str(time_total,lVar10);
  time2str(time_spent,(long)dVar17);
  uVar3 = (data->progress).flags;
  uVar14 = (&(data->progress).size_dl)[(ulong)((uVar3 & 0x40) == 0) * 2] +
           (&(data->progress).size_ul)[(ulong)((uVar3 & 0x20) == 0) * 2];
  lVar9 = (data->progress).uploaded + (data->progress).downloaded;
  if ((long)uVar14 < 0x2711) {
    if ((long)uVar14 < 1) {
      lVar9 = 0;
    }
    else {
      lVar9 = (lVar9 * 100) / (long)uVar14;
    }
  }
  else {
    lVar9 = lVar9 / (long)(uVar14 / 100);
  }
  whereto = (data->set).err;
  max5data(uVar14,max5[2]);
  max5data((data->progress).downloaded,max5[0]);
  max5data((data->progress).uploaded,max5[1]);
  max5data((data->progress).dlspeed,max5[3]);
  max5data((data->progress).ulspeed,max5[4]);
  max5data((data->progress).current_speed,max5[5]);
  curl_mfprintf(whereto,"\r%3ld %s  %3ld %s  %3ld %s  %s  %s %s %s %s %s",lVar9,max5 + 2,local_b0,
                max5,local_a8,max5 + 1,max5 + 3,max5 + 4,time_total,time_spent,time_left,max5 + 5);
  fflush((FILE *)(data->set).err);
  return 0;
}

Assistant:

int Curl_pgrsUpdate(struct connectdata *conn)
{
  struct timeval now;
  int result;
  char max5[6][10];
  curl_off_t dlpercen=0;
  curl_off_t ulpercen=0;
  curl_off_t total_percen=0;
  curl_off_t total_transfer;
  curl_off_t total_expected_transfer;
  curl_off_t timespent;
  struct SessionHandle *data = conn->data;
  int nowindex = data->progress.speeder_c% CURR_TIME;
  int checkindex;
  int countindex; /* amount of seconds stored in the speeder array */
  char time_left[10];
  char time_total[10];
  char time_spent[10];
  curl_off_t ulestimate=0;
  curl_off_t dlestimate=0;
  curl_off_t total_estimate;
  bool shownow=FALSE;

  now = Curl_tvnow(); /* what time is it */

  /* The time spent so far (from the start) */
  data->progress.timespent =
    (double)(now.tv_sec - data->progress.start.tv_sec) +
    (double)(now.tv_usec - data->progress.start.tv_usec)/1000000.0;
  timespent = (curl_off_t)data->progress.timespent;

  /* The average download speed this far */
  data->progress.dlspeed = (curl_off_t)
    ((double)data->progress.downloaded/
     (data->progress.timespent>0?data->progress.timespent:1));

  /* The average upload speed this far */
  data->progress.ulspeed = (curl_off_t)
    ((double)data->progress.uploaded/
     (data->progress.timespent>0?data->progress.timespent:1));

  /* Calculations done at most once a second, unless end is reached */
  if(data->progress.lastshow != (long)now.tv_sec) {
    shownow = TRUE;

    data->progress.lastshow = now.tv_sec;

    /* Let's do the "current speed" thing, which should use the fastest
       of the dl/ul speeds. Store the faster speed at entry 'nowindex'. */
    data->progress.speeder[ nowindex ] =
      data->progress.downloaded>data->progress.uploaded?
      data->progress.downloaded:data->progress.uploaded;

    /* remember the exact time for this moment */
    data->progress.speeder_time [ nowindex ] = now;

    /* advance our speeder_c counter, which is increased every time we get
       here and we expect it to never wrap as 2^32 is a lot of seconds! */
    data->progress.speeder_c++;

    /* figure out how many index entries of data we have stored in our speeder
       array. With N_ENTRIES filled in, we have about N_ENTRIES-1 seconds of
       transfer. Imagine, after one second we have filled in two entries,
       after two seconds we've filled in three entries etc. */
    countindex = ((data->progress.speeder_c>=CURR_TIME)?
                  CURR_TIME:data->progress.speeder_c) - 1;

    /* first of all, we don't do this if there's no counted seconds yet */
    if(countindex) {
      long span_ms;

      /* Get the index position to compare with the 'nowindex' position.
         Get the oldest entry possible. While we have less than CURR_TIME
         entries, the first entry will remain the oldest. */
      checkindex = (data->progress.speeder_c>=CURR_TIME)?
        data->progress.speeder_c%CURR_TIME:0;

      /* Figure out the exact time for the time span */
      span_ms = Curl_tvdiff(now,
                            data->progress.speeder_time[checkindex]);
      if(0 == span_ms)
        span_ms=1; /* at least one millisecond MUST have passed */

      /* Calculate the average speed the last 'span_ms' milliseconds */
      {
        curl_off_t amount = data->progress.speeder[nowindex]-
          data->progress.speeder[checkindex];

        if(amount > CURL_OFF_T_C(4294967) /* 0xffffffff/1000 */)
          /* the 'amount' value is bigger than would fit in 32 bits if
             multiplied with 1000, so we use the double math for this */
          data->progress.current_speed = (curl_off_t)
            ((double)amount/((double)span_ms/1000.0));
        else
          /* the 'amount' value is small enough to fit within 32 bits even
             when multiplied with 1000 */
          data->progress.current_speed = amount*CURL_OFF_T_C(1000)/span_ms;
      }
    }
    else
      /* the first second we use the main average */
      data->progress.current_speed =
        (data->progress.ulspeed>data->progress.dlspeed)?
        data->progress.ulspeed:data->progress.dlspeed;

  } /* Calculations end */

  if(!(data->progress.flags & PGRS_HIDE)) {
    /* progress meter has not been shut off */

    if(data->set.fxferinfo) {
      /* There's a callback set, call that */
      result= data->set.fxferinfo(data->set.progress_client,
                                  data->progress.size_dl,
                                  data->progress.downloaded,
                                  data->progress.size_ul,
                                  data->progress.uploaded);
      if(result)
        failf(data, "Callback aborted");
      return result;
    }
    else if(data->set.fprogress) {
      /* The older deprecated callback is set, call that */
      result= data->set.fprogress(data->set.progress_client,
                                  (double)data->progress.size_dl,
                                  (double)data->progress.downloaded,
                                  (double)data->progress.size_ul,
                                  (double)data->progress.uploaded);
      if(result)
        failf(data, "Callback aborted");
      return result;
    }

    if(!shownow)
      /* only show the internal progress meter once per second */
      return 0;

    /* If there's no external callback set, use internal code to show
       progress */

    if(!(data->progress.flags & PGRS_HEADERS_OUT)) {
      if(data->state.resume_from) {
        fprintf(data->set.err,
                "** Resuming transfer from byte position %"
                CURL_FORMAT_CURL_OFF_T "\n", data->state.resume_from);
      }
      fprintf(data->set.err,
              "  %% Total    %% Received %% Xferd  Average Speed   "
              "Time    Time     Time  Current\n"
              "                                 Dload  Upload   "
              "Total   Spent    Left  Speed\n");
      data->progress.flags |= PGRS_HEADERS_OUT; /* headers are shown */
    }

    /* Figure out the estimated time of arrival for the upload */
    if((data->progress.flags & PGRS_UL_SIZE_KNOWN) &&
       (data->progress.ulspeed > CURL_OFF_T_C(0))) {
      ulestimate = data->progress.size_ul / data->progress.ulspeed;

      if(data->progress.size_ul > CURL_OFF_T_C(10000))
        ulpercen = data->progress.uploaded /
          (data->progress.size_ul/CURL_OFF_T_C(100));
      else if(data->progress.size_ul > CURL_OFF_T_C(0))
        ulpercen = (data->progress.uploaded*100) /
          data->progress.size_ul;
    }

    /* ... and the download */
    if((data->progress.flags & PGRS_DL_SIZE_KNOWN) &&
       (data->progress.dlspeed > CURL_OFF_T_C(0))) {
      dlestimate = data->progress.size_dl / data->progress.dlspeed;

      if(data->progress.size_dl > CURL_OFF_T_C(10000))
        dlpercen = data->progress.downloaded /
          (data->progress.size_dl/CURL_OFF_T_C(100));
      else if(data->progress.size_dl > CURL_OFF_T_C(0))
        dlpercen = (data->progress.downloaded*100) /
          data->progress.size_dl;
    }

    /* Now figure out which of them is slower and use that one for the
       total estimate! */
    total_estimate = ulestimate>dlestimate?ulestimate:dlestimate;

    /* create the three time strings */
    time2str(time_left, total_estimate > 0?(total_estimate - timespent):0);
    time2str(time_total, total_estimate);
    time2str(time_spent, timespent);

    /* Get the total amount of data expected to get transferred */
    total_expected_transfer =
      (data->progress.flags & PGRS_UL_SIZE_KNOWN?
       data->progress.size_ul:data->progress.uploaded)+
      (data->progress.flags & PGRS_DL_SIZE_KNOWN?
       data->progress.size_dl:data->progress.downloaded);

    /* We have transferred this much so far */
    total_transfer = data->progress.downloaded + data->progress.uploaded;

    /* Get the percentage of data transferred so far */
    if(total_expected_transfer > CURL_OFF_T_C(10000))
      total_percen = total_transfer /
        (total_expected_transfer/CURL_OFF_T_C(100));
    else if(total_expected_transfer > CURL_OFF_T_C(0))
      total_percen = (total_transfer*100) / total_expected_transfer;

    fprintf(data->set.err,
            "\r"
            "%3" CURL_FORMAT_CURL_OFF_T " %s  "
            "%3" CURL_FORMAT_CURL_OFF_T " %s  "
            "%3" CURL_FORMAT_CURL_OFF_T " %s  %s  %s %s %s %s %s",
            total_percen,  /* 3 letters */                /* total % */
            max5data(total_expected_transfer, max5[2]),   /* total size */
            dlpercen,      /* 3 letters */                /* rcvd % */
            max5data(data->progress.downloaded, max5[0]), /* rcvd size */
            ulpercen,      /* 3 letters */                /* xfer % */
            max5data(data->progress.uploaded, max5[1]),   /* xfer size */
            max5data(data->progress.dlspeed, max5[3]),    /* avrg dl speed */
            max5data(data->progress.ulspeed, max5[4]),    /* avrg ul speed */
            time_total,    /* 8 letters */                /* total time */
            time_spent,    /* 8 letters */                /* time spent */
            time_left,     /* 8 letters */                /* time left */
            max5data(data->progress.current_speed, max5[5]) /* current speed */
            );

    /* we flush the output stream to make it appear as soon as possible */
    fflush(data->set.err);

  } /* !(data->progress.flags & PGRS_HIDE) */

  return 0;
}